

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.c
# Opt level: O3

void md5_append(md5_state_t *pms,md5_byte_t *data,size_t nbytes)

{
  uint uVar1;
  md5_word_t mVar2;
  uint uVar3;
  size_t __n;
  uint uVar4;
  ulong uVar5;
  
  if (nbytes != 0) {
    uVar1 = pms->count[0];
    uVar4 = uVar1 >> 3 & 0x3f;
    uVar5 = (ulong)uVar4;
    mVar2 = (int)(nbytes >> 0x1d) + pms->count[1];
    uVar3 = (int)nbytes * 8;
    pms->count[1] = mVar2;
    pms->count[0] = uVar3 + uVar1;
    if (CARRY4(uVar3,uVar1)) {
      pms->count[1] = mVar2 + 1;
    }
    if (uVar4 != 0) {
      __n = 0x40 - uVar5;
      if (nbytes + uVar5 < 0x41) {
        __n = nbytes;
      }
      memcpy(pms->buf + uVar5,data,__n);
      if (uVar5 + __n < 0x40) {
        return;
      }
      data = data + __n;
      nbytes = nbytes - __n;
      md5_process(pms,pms->buf);
    }
    for (; 0x3f < nbytes; nbytes = nbytes - 0x40) {
      md5_process(pms,data);
      data = data + 0x40;
    }
    if (nbytes != 0) {
      memcpy(pms->buf,data,nbytes);
      return;
    }
  }
  return;
}

Assistant:

static void md5_append(md5_state_t* pms, const md5_byte_t* data, size_t nbytes)
{
  const md5_byte_t* p = data;
  size_t left = nbytes;
  size_t offset = (pms->count[0] >> 3) & 63;
  md5_word_t nbits = (md5_word_t)(nbytes << 3);

  if (nbytes <= 0) {
    return;
  }

  /* Update the message length. */
  pms->count[1] += (md5_word_t)(nbytes >> 29);
  pms->count[0] += nbits;
  if (pms->count[0] < nbits) {
    pms->count[1]++;
  }

  /* Process an initial partial block. */
  if (offset) {
    size_t copy = (offset + nbytes > 64 ? 64 - offset : nbytes);

    memcpy(pms->buf + offset, p, copy);
    if (offset + copy < 64) {
      return;
    }
    p += copy;
    left -= copy;
    md5_process(pms, pms->buf);
  }

  /* Process full blocks. */
  for (; left >= 64; p += 64, left -= 64) {
    md5_process(pms, p);
  }

  /* Process a final partial block. */
  if (left) {
    memcpy(pms->buf, p, left);
  }
}